

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::both(json_service *this,string *msg)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream oss;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  value *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffe18;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  uVar2 = cppcms::rpc::json_rpc_server::notification();
  if ((uVar2 & 1) == 0) {
    std::operator+(in_stack_fffffffffffffe18,in_RDI);
    cppcms::json::value::value<std::__cxx11::string>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    cppcms::rpc::json_rpc_server::return_result((value *)in_RDI);
    cppcms::json::value::~value((value *)0x11e069);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar3 = std::operator<<((ostream *)local_188,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4e);
      std::operator<<(poVar3," msg==\"notification\"");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_1b8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void both(std::string msg)
	{
		if(notification())
			TEST(msg=="notification");
		else
			return_result("call:"+msg);
	}